

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.cpp
# Opt level: O0

void Assert::throwif(bool b,string *message)

{
  ostream *poVar1;
  undefined8 uVar2;
  ostringstream local_190 [8];
  ostringstream buf;
  string *message_local;
  bool b_local;
  
  if (b) {
    std::__cxx11::ostringstream::ostringstream(local_190,_S_out);
    poVar1 = std::operator<<((ostream *)local_190,"Assert error: ");
    std::operator<<(poVar1,(string *)message);
    uVar2 = __cxa_allocate_exception(0x20);
    std::__cxx11::ostringstream::str();
    __cxa_throw(uVar2,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  unit_test_runner.passed = unit_test_runner.passed + 1;
  return;
}

Assistant:

void Assert::throwif(bool b, const string &message)
{
    if (b) {
        std::ostringstream buf(std::ostringstream::out);
        buf << "Assert error: " << message;
        throw buf.str();
    }
    ++unit_test_runner.passed;
}